

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_cyclicrefresh.c
# Opt level: O0

int candidate_refresh_aq
              (CYCLIC_REFRESH *cr,MB_MODE_INFO *mbmi,int64_t rate,int64_t dist,BLOCK_SIZE bsize,
              int noise_level)

{
  MV MVar1;
  int iVar2;
  int iVar3;
  long in_RCX;
  long in_RDX;
  MB_MODE_INFO *in_RSI;
  long in_RDI;
  undefined1 in_R8B;
  int in_R9D;
  int is_compound;
  MV mv;
  short local_34;
  short sStackY_32;
  undefined3 in_stack_ffffffffffffffd4;
  undefined4 uVar4;
  int local_4;
  
  uVar4 = CONCAT13(in_R8B,in_stack_ffffffffffffffd4);
  MVar1 = in_RSI->mv[0].as_mv;
  iVar2 = has_second_ref(in_RSI);
  if (((iVar2 == 0) && (*(long *)(in_RDI + 0x38) < in_RCX)) &&
     ((local_34 = MVar1.row, *(short *)(in_RDI + 0x40) < local_34 ||
      ((((SBORROW4((int)local_34,-(int)*(short *)(in_RDI + 0x40)) !=
          (int)local_34 + (int)*(short *)(in_RDI + 0x40) < 0 ||
         (sStackY_32 = MVar1.col, *(short *)(in_RDI + 0x40) < sStackY_32)) ||
        (SBORROW4((int)sStackY_32,-(int)*(short *)(in_RDI + 0x40)) !=
         (int)sStackY_32 + (int)*(short *)(in_RDI + 0x40) < 0)) ||
       (iVar3 = is_inter_block((MB_MODE_INFO *)CONCAT44(uVar4,in_R9D)), iVar3 == 0)))))) {
    return 0;
  }
  if (((iVar2 == 0) || (1 < in_R9D)) &&
     (((((byte)((uint)uVar4 >> 0x18) < 6 ||
        ((*(long *)(in_RDI + 0x30) <= in_RDX ||
         (iVar2 = is_inter_block((MB_MODE_INFO *)CONCAT44(uVar4,in_R9D)), iVar2 == 0)))) ||
       (in_RSI->mv[0].as_int != 0)) || (*(int *)(in_RDI + 0x58) < 0xb)))) {
    local_4 = 1;
  }
  else {
    local_4 = 2;
  }
  return local_4;
}

Assistant:

static int candidate_refresh_aq(const CYCLIC_REFRESH *cr,
                                const MB_MODE_INFO *mbmi, int64_t rate,
                                int64_t dist, BLOCK_SIZE bsize,
                                int noise_level) {
  MV mv = mbmi->mv[0].as_mv;
  int is_compound = has_second_ref(mbmi);
  // Reject the block for lower-qp coding for non-compound mode if
  // projected distortion is above the threshold, and any of the following
  // is true:
  // 1) mode uses large mv
  // 2) mode is an intra-mode
  // Otherwise accept for refresh.
  if (!is_compound && dist > cr->thresh_dist_sb &&
      (mv.row > cr->motion_thresh || mv.row < -cr->motion_thresh ||
       mv.col > cr->motion_thresh || mv.col < -cr->motion_thresh ||
       !is_inter_block(mbmi)))
    return CR_SEGMENT_ID_BASE;
  else if ((is_compound && noise_level < kMedium) ||
           (bsize >= BLOCK_16X16 && rate < cr->thresh_rate_sb &&
            is_inter_block(mbmi) && mbmi->mv[0].as_int == 0 &&
            cr->rate_boost_fac > 10))
    // More aggressive delta-q for bigger blocks with zero motion.
    return CR_SEGMENT_ID_BOOST2;
  else
    return CR_SEGMENT_ID_BOOST1;
}